

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

optional<pbrt::LightBounds> * __thiscall pbrt::GoniometricLight::Bounds(GoniometricLight *this)

{
  Vector3f w;
  WrapMode2D wrapMode;
  Point2i PVar1;
  long in_RSI;
  Transform *in_RDI;
  Image *this_00;
  Float FVar2;
  double dVar3;
  undefined1 auVar5 [56];
  undefined1 auVar4 [64];
  Point3<float> PVar6;
  Tuple3<pbrt::Point3,_float> in_stack_00000010;
  Point3f p;
  Float phi;
  int x;
  int y;
  Float sumY;
  float in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  float fVar7;
  undefined8 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined1 twoSided;
  long in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea8;
  int iVar8;
  Transform *this_01;
  undefined8 local_124;
  float in_stack_fffffffffffffee4;
  Image *in_stack_fffffffffffffee8;
  WrapMode in_stack_fffffffffffffef4;
  WrapMode in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff14;
  Tuple3<pbrt::Point3,_float> in_stack_ffffffffffffff28;
  Tuple3<pbrt::Point3,_float> in_stack_ffffffffffffff48;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 local_2c;
  undefined4 local_24;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined4 local_14;
  Transform *this_02;
  
  local_14 = 0.0;
  local_18 = 0;
  this_01 = in_RDI;
  this_02 = in_RDI;
  while( true ) {
    iVar8 = local_18;
    PVar1 = Image::Resolution((Image *)(in_RSI + 0xa8));
    uStack_1c = PVar1.super_Tuple2<pbrt::Point2,_int>.y;
    if (uStack_1c <= iVar8) break;
    local_24 = 0;
    while( true ) {
      in_stack_fffffffffffffea8 = local_24;
      PVar1 = Image::Resolution((Image *)(in_RSI + 0xa8));
      local_2c = PVar1.super_Tuple2<pbrt::Point2,_int>.x;
      if (local_2c <= in_stack_fffffffffffffea8) break;
      in_stack_fffffffffffffea0 = in_RSI + 0xa8;
      Point2<int>::Point2((Point2<int> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                          (int)in_stack_fffffffffffffe6c,(int)in_stack_fffffffffffffe68);
      WrapMode2D::WrapMode2D
                ((WrapMode2D *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (WrapMode)((ulong)in_stack_fffffffffffffe78 >> 0x20));
      PVar1.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffff00;
      PVar1.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffefc;
      wrapMode.wrap.values[1] = in_stack_fffffffffffffef8;
      wrapMode.wrap.values[0] = in_stack_fffffffffffffef4;
      FVar2 = Image::GetChannel(in_stack_fffffffffffffee8,PVar1,(int)in_stack_fffffffffffffee4,
                                wrapMode);
      local_14 = FVar2 + local_14;
      local_24 = local_24 + 1;
    }
    local_18 = local_18 + 1;
  }
  fVar7 = *(float *)(in_RSI + 0xa0);
  FVar2 = DenselySampledSpectrum::MaxValue
                    ((DenselySampledSpectrum *)CONCAT44(fVar7,in_stack_fffffffffffffe70));
  local_14 = fVar7 * FVar2 * 4.0 * 3.1415927 * local_14;
  this_00 = (Image *)(in_RSI + 0xa8);
  PVar1 = Image::Resolution(this_00);
  local_48 = PVar1.super_Tuple2<pbrt::Point2,_int>.x;
  PVar1 = Image::Resolution(this_00);
  uStack_4c = PVar1.super_Tuple2<pbrt::Point2,_int>.y;
  twoSided = (undefined1)((uint)(local_14 / (float)(local_48 * uStack_4c)) >> 0x18);
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(fVar7,in_stack_fffffffffffffe70),in_stack_fffffffffffffe6c,
             in_stack_fffffffffffffe68,0.0);
  auVar5 = ZEXT856(0);
  PVar6 = Transform::operator()(this_02,in_stack_00000010);
  auVar4._0_8_ = PVar6.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar5;
  vmovlpd_avx(auVar4._0_16_);
  Bounds3<float>::Bounds3
            ((Bounds3<float> *)
             CONCAT44(in_stack_ffffffffffffff14,PVar6.super_Tuple3<pbrt::Point3,_float>.z),
             (Point3<float>)in_stack_ffffffffffffff48,(Point3<float>)in_stack_ffffffffffffff28);
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(fVar7,in_stack_fffffffffffffe70),in_stack_fffffffffffffe6c,
             in_stack_fffffffffffffe68,0.0);
  dVar3 = std::cos(5.32864626443882e-315);
  FVar2 = SUB84(dVar3,0);
  std::cos(SUB648(ZEXT464(0x3fc90fdb),0));
  w.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffee4;
  w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_124;
  LightBounds::LightBounds
            ((LightBounds *)this_01,(Bounds3f *)CONCAT44(iVar8,in_stack_fffffffffffffea8),w,
             (Float)((ulong)in_stack_fffffffffffffea0 >> 0x20),(Float)in_stack_fffffffffffffea0,
             FVar2,(bool)twoSided);
  pstd::optional<pbrt::LightBounds>::optional
            ((optional<pbrt::LightBounds> *)CONCAT44(fVar7,in_stack_fffffffffffffe70),
             (LightBounds *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  return (optional<pbrt::LightBounds> *)in_RDI;
}

Assistant:

pstd::optional<LightBounds> GoniometricLight::Bounds() const {
    Float sumY = 0;
    for (int y = 0; y < image.Resolution().y; ++y)
        for (int x = 0; x < image.Resolution().x; ++x)
            sumY += image.GetChannel({x, y}, 0);
    Float phi = scale * Iemit->MaxValue() * 4 * Pi * sumY /
                (image.Resolution().x * image.Resolution().y);

    Point3f p = renderFromLight(Point3f(0, 0, 0));
    // Bound it as an isotropic point light.
    return LightBounds(Bounds3f(p, p), Vector3f(0, 0, 1), phi, std::cos(Pi),
                       std::cos(Pi / 2), false);
}